

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZShapeHDivConstant.cpp
# Opt level: O3

void TPZShapeHDivConstant<pzshape::TPZShapePrism>::Initialize
               (TPZVec<long> *ids,TPZVec<int> *connectorders,TPZVec<int> *sideorient,
               TPZShapeData *data)

{
  int *piVar1;
  ulong uVar2;
  int *piVar3;
  long lVar4;
  ulong uVar5;
  undefined1 auVar6 [16];
  undefined1 auVar8 [16];
  TPZManVector<int,_15> locconorders;
  undefined4 auStack_a8 [2];
  TPZManVector<int,_20> local_a0;
  long lVar7;
  
  piVar1 = local_a0.fExtAlloc;
  local_a0.super_TPZVec<int>.fStore = (int *)0x0;
  local_a0.super_TPZVec<int>.fNElements = 0;
  local_a0.super_TPZVec<int>.fNAlloc = 0;
  local_a0.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_018237a0;
  uVar2 = sideorient->fNElements;
  if ((long)uVar2 < 0x15) {
    local_a0.super_TPZVec<int>.fStore = piVar1;
    if ((long)uVar2 < 1) goto LAB_01013211;
  }
  else {
    local_a0.super_TPZVec<int>.fStore =
         (int *)operator_new__(-(ulong)(uVar2 >> 0x3e != 0) | uVar2 * 4);
    local_a0.super_TPZVec<int>.fNAlloc = uVar2;
  }
  piVar3 = sideorient->fStore;
  uVar5 = 0;
  do {
    local_a0.super_TPZVec<int>.fStore[uVar5] = piVar3[uVar5];
    uVar5 = uVar5 + 1;
  } while (uVar2 != uVar5);
LAB_01013211:
  local_a0.super_TPZVec<int>.fNElements = uVar2;
  TPZManVector<int,_20>::operator=(&data->fSideOrient,&local_a0);
  if (local_a0.super_TPZVec<int>.fStore != piVar1) {
    local_a0.super_TPZVec<int>.fNAlloc = 0;
    local_a0.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813ef0;
    if (local_a0.super_TPZVec<int>.fStore != (int *)0x0) {
      operator_delete__(local_a0.super_TPZVec<int>.fStore);
    }
  }
  TPZManVector<int,_27>::Resize(&data->fHDivConnectOrders,6);
  TPZManVector<int,_27>::Resize(&data->fHDivNumConnectShape,6);
  TPZVec<int>::TPZVec(&local_a0.super_TPZVec<int>,0);
  local_a0.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_018bd9a0;
  local_a0.super_TPZVec<int>.fNElements = 0xf;
  local_a0.super_TPZVec<int>.fNAlloc = 0;
  lVar4 = 0xb;
  auVar6 = _DAT_014d2b10;
  auVar8 = _DAT_014d28b0;
  do {
    if (SUB164(auVar8 ^ _DAT_014d28c0,4) == -0x80000000 &&
        SUB164(auVar8 ^ _DAT_014d28c0,0) < -0x7ffffff1) {
      auStack_a8[lVar4 + -1] = 1;
      auStack_a8[lVar4] = 1;
    }
    if (SUB164(auVar6 ^ _DAT_014d28c0,4) == -0x80000000 &&
        SUB164(auVar6 ^ _DAT_014d28c0,0) < -0x7ffffff1) {
      auStack_a8[lVar4 + 1] = 1;
      local_a0.fExtAlloc[lVar4 + -8] = 1;
    }
    lVar7 = auVar8._8_8_;
    auVar8._0_8_ = auVar8._0_8_ + 4;
    auVar8._8_8_ = lVar7 + 4;
    lVar7 = auVar6._8_8_;
    auVar6._0_8_ = auVar6._0_8_ + 4;
    auVar6._8_8_ = lVar7 + 4;
    lVar4 = lVar4 + 4;
  } while (lVar4 != 0x1b);
  piVar3 = connectorders->fStore;
  lVar4 = 0;
  do {
    local_a0.fExtAlloc[lVar4 + 9] = piVar3[lVar4];
    lVar4 = lVar4 + 1;
  } while (lVar4 != 6);
  local_a0.super_TPZVec<int>.fStore = piVar1;
  TPZShapeHCurlNoGrads<pzshape::TPZShapePrism>::Initialize(ids,&local_a0.super_TPZVec<int>,data);
  if (local_a0.super_TPZVec<int>.fStore != piVar1) {
    local_a0.super_TPZVec<int>.fNAlloc = 0;
    local_a0.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813ef0;
    if (local_a0.super_TPZVec<int>.fStore != (int *)0x0) {
      operator_delete__(local_a0.super_TPZVec<int>.fStore);
    }
  }
  return;
}

Assistant:

void TPZShapeHDivConstant<TSHAPE>::Initialize(TPZVec<int64_t> &ids,
                TPZVec<int> &connectorders,
                const TPZVec<int>& sideorient, 
                TPZShapeData &data)
{
    data.fSideOrient = sideorient;
    data.fHDivConnectOrders.Resize(TSHAPE::NFacets+1);
    data.fHDivNumConnectShape.Resize(TSHAPE::NFacets+1);
    if(TSHAPE::Dimension == 2)
    {
        //Compatibilize the polynomial order
        int conSize = connectorders.size();
        for (int i = 0; i < conSize; i++){
            connectorders[i]++;
        }
        if (TSHAPE::Type() == ETriangle){
            connectorders[conSize-1]++;
        }
        //Initialize data structures
        TPZShapeH1<TSHAPE>::Initialize(ids,connectorders,data);

        for(int ic = 0; ic<TSHAPE::NFacets;ic++)
        {
            data.fHDivConnectOrders[ic] =  connectorders[ic];
            data.fHDivNumConnectShape[ic] = data.fH1NumConnectShape[ic]+1;
        }
        int ic = TSHAPE::NFacets;
        data.fHDivConnectOrders[ic] =  connectorders[ic];
        data.fHDivNumConnectShape[ic] = data.fH1NumConnectShape[ic];
    }
    else
    {
        //Compatibilize the polynomial order
        if (TSHAPE::Type() == ETetraedro) {
            int conSize = connectorders.size();
            for (int i = 0; i < conSize; i++){
                connectorders[i]++;
            }
            connectorders[conSize-1]++;
        }

        const int nedges = TSHAPE::NSides-TSHAPE::NFacets-TSHAPE::NCornerNodes-1;
        TPZManVector<int,15> locconorders(TSHAPE::NSides-TSHAPE::NCornerNodes,1);
        for(int ic = nedges; ic<TSHAPE::NSides-TSHAPE::NCornerNodes; ic++)
        {
            locconorders[ic] = connectorders[ic-nedges];
        }
        TPZShapeHCurlNoGrads<TSHAPE>::Initialize(ids, locconorders, data);
//        TPZManVector<int> HCurlNumConnectShapeF = data.fHDivNumConnectShape;
//        data.fHDivNumConnectShape.Resize(TSHAPE::NFacets+1);
//        for(int ic=nedges; ic<TSHAPE::NSides-TSHAPE::NCornerNodes-1; ic++)
//        {
//            int numshape = HCurlNumConnectShapeF[ic]+1;
//            data.fHDivNumConnectShape[ic-nedges] = numshape;
//        }
//        int ic = TSHAPE::NSides-TSHAPE::NCornerNodes-1;
//        int numshape = HCurlNumConnectShapeF[ic];
//        data.fHDivNumConnectShape[ic-nedges] = numshape;
    }
}